

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

NamedTypeSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::NamedTypeSyntax,slang::syntax::NamedTypeSyntax_const&>
          (BumpAllocator *this,NamedTypeSyntax *args)

{
  NamedTypeSyntax *pNVar1;
  undefined8 *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pNVar1 = (NamedTypeSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  *(undefined8 *)&(pNVar1->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode = *in_RSI;
  (pNVar1->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.parent =
       (SyntaxNode *)in_RSI[1];
  (pNVar1->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode =
       (SyntaxNode *)in_RSI[2];
  (pNVar1->name).ptr = (NameSyntax *)in_RSI[3];
  return pNVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }